

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::WaitForkStatementSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,WaitForkStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  SyntaxNode *local_70;
  size_t index_local;
  WaitForkStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    TokenOrSyntax::TokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_70 = (SyntaxNode *)0x0;
    if (this != (WaitForkStatementSyntax *)0xffffffffffffffe8) {
      local_70 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 2:
    token.kind = (this->wait).kind;
    token._2_1_ = (this->wait).field_0x2;
    token.numFlags.raw = (this->wait).numFlags.raw;
    token.rawLen = (this->wait).rawLen;
    token.info = (this->wait).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    token_00.kind = (this->fork).kind;
    token_00._2_1_ = (this->fork).field_0x2;
    token_00.numFlags.raw = (this->fork).numFlags.raw;
    token_00.rawLen = (this->fork).rawLen;
    token_00.info = (this->fork).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    token_01.kind = (this->semi).kind;
    token_01._2_1_ = (this->semi).field_0x2;
    token_01.numFlags.raw = (this->semi).numFlags.raw;
    token_01.rawLen = (this->semi).rawLen;
    token_01.info = (this->semi).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax WaitForkStatementSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return wait;
        case 3: return fork;
        case 4: return semi;
        default: return nullptr;
    }
}